

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoystickManager.cpp
# Opt level: O0

void __thiscall sf::priv::JoystickManager::update(JoystickManager *this)

{
  bool bVar1;
  uint uVar2;
  int __oflag;
  undefined1 *__src;
  long in_RDI;
  Item *item;
  uint i;
  JoystickImpl *in_stack_fffffffffffffe78;
  JoystickState *in_stack_fffffffffffffe80;
  JoystickImpl *in_stack_fffffffffffffea0;
  char local_144 [8];
  char acStack_13c [8];
  char local_134 [16];
  float local_124 [2];
  float afStack_11c [2];
  float local_114 [4];
  bool local_104 [4];
  JoystickImpl *this_00;
  JoystickCaps local_100;
  float fStack_f8;
  JoystickState local_d8;
  undefined8 uStack_94;
  undefined8 local_8c;
  undefined8 uStack_84;
  undefined8 local_7c;
  undefined8 uStack_74;
  undefined4 local_6c;
  undefined8 local_68;
  float local_60;
  undefined1 local_5c [68];
  JoystickImpl *local_18;
  uint local_c;
  
  for (local_c = 0; local_c < 8; local_c = local_c + 1) {
    local_18 = (JoystickImpl *)(in_RDI + (ulong)local_c * 0x128);
    if ((local_18[1].m_file & 1) == 0) {
      bVar1 = JoystickImpl::isConnected((uint)in_stack_fffffffffffffe80);
      if ((bVar1) &&
         (uVar2 = JoystickImpl::open(local_18,(char *)(ulong)local_c,__oflag), (uVar2 & 1) != 0)) {
        local_100 = JoystickImpl::getCapabilities(in_stack_fffffffffffffea0);
        local_18[1].m_state.axes[1] = fStack_f8;
        *(JoystickImpl **)&local_18[1].m_state = this_00;
        JoystickImpl::update(this_00);
        *(bool (*) [4])(local_18[1].m_mapping + 0x3c) = local_104;
        *(undefined8 *)(local_18[1].m_mapping + 0x2c) = local_114._0_8_;
        *(undefined8 *)(local_18[1].m_mapping + 0x34) = local_114._8_8_;
        *(float (*) [2])(local_18[1].m_mapping + 0x1c) = local_124;
        *(float (*) [2])(local_18[1].m_mapping + 0x24) = afStack_11c;
        *(undefined8 *)(local_18[1].m_mapping + 0xc) = local_134._0_8_;
        *(undefined8 *)(local_18[1].m_mapping + 0x14) = local_134._8_8_;
        *(char (*) [8])(local_18 + 1) = local_144;
        *(char (*) [8])(local_18[1].m_mapping + 4) = acStack_13c;
        in_stack_fffffffffffffe78 = (JoystickImpl *)&stack0xfffffffffffffe90;
        JoystickImpl::getIdentification(in_stack_fffffffffffffe78);
        Joystick::Identification::operator=
                  ((Identification *)in_stack_fffffffffffffe80,
                   (Identification *)in_stack_fffffffffffffe78);
        Joystick::Identification::~Identification((Identification *)0x30a587);
      }
    }
    else {
      JoystickImpl::update(this_00);
      __src = local_5c;
      memcpy(local_18 + 1,__src,0x44);
      if ((local_18[1].m_file & 1) == 0) {
        JoystickImpl::close(local_18,(int)__src);
        JoystickCaps::JoystickCaps((JoystickCaps *)in_stack_fffffffffffffe80);
        local_18[1].m_state.axes[1] = local_60;
        local_18[1].m_state.connected = (bool)(undefined1)local_68;
        *(undefined3 *)&local_18[1].m_state.field_0x1 = local_68._1_3_;
        local_18[1].m_state.axes[0] = (float)local_68._4_4_;
        JoystickState::JoystickState(in_stack_fffffffffffffe80);
        *(undefined4 *)(local_18[1].m_mapping + 0x3c) = local_6c;
        *(undefined8 *)(local_18[1].m_mapping + 0x2c) = local_7c;
        *(undefined8 *)(local_18[1].m_mapping + 0x34) = uStack_74;
        *(undefined8 *)(local_18[1].m_mapping + 0x1c) = local_8c;
        *(undefined8 *)(local_18[1].m_mapping + 0x24) = uStack_84;
        *(undefined8 *)(local_18[1].m_mapping + 0xc) = local_d8.buttons._24_8_;
        *(undefined8 *)(local_18[1].m_mapping + 0x14) = uStack_94;
        *(undefined8 *)(local_18 + 1) = local_d8.buttons._8_8_;
        *(undefined8 *)(local_18[1].m_mapping + 4) = local_d8.buttons._16_8_;
        in_stack_fffffffffffffe80 = &local_d8;
        Joystick::Identification::Identification((Identification *)in_stack_fffffffffffffea0);
        Joystick::Identification::operator=
                  ((Identification *)in_stack_fffffffffffffe80,
                   (Identification *)in_stack_fffffffffffffe78);
        Joystick::Identification::~Identification((Identification *)0x30a439);
      }
    }
  }
  return;
}

Assistant:

void JoystickManager::update()
{
    for (unsigned int i = 0; i < Joystick::Count; ++i)
    {
        Item& item = m_joysticks[i];

        if (item.state.connected)
        {
            // Get the current state of the joystick
            item.state = item.joystick.update();

            // Check if it's still connected
            if (!item.state.connected)
            {
                item.joystick.close();
                item.capabilities   = JoystickCaps();
                item.state          = JoystickState();
                item.identification = Joystick::Identification();
            }
        }
        else
        {
            // Check if the joystick was connected since last update
            if (JoystickImpl::isConnected(i))
            {
                if (item.joystick.open(i))
                {
                    item.capabilities   = item.joystick.getCapabilities();
                    item.state          = item.joystick.update();
                    item.identification = item.joystick.getIdentification();
                }
            }
        }
    }
}